

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_functions.hpp
# Opt level: O2

int concatenate_results(void *arg,int ncols,char **vals,char **colnames)

{
  long lVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (*(long *)((long)arg + 8) == *arg) {
    Catch::clara::std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::resize((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)arg,(long)ncols);
  }
  uVar2 = 0;
  uVar4 = (ulong)(uint)ncols;
  if (ncols < 1) {
    uVar4 = uVar2;
  }
  for (; uVar4 * 0x18 - uVar2 != 0; uVar2 = uVar2 + 0x18) {
    lVar1 = *arg;
    pcVar3 = *vals;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = "NULL";
    }
    std::__cxx11::string::string((string *)&local_50,pcVar3,&local_51);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(lVar1 + uVar2),
               &local_50);
    std::__cxx11::string::~string((string *)&local_50);
    vals = vals + 1;
  }
  return 0;
}

Assistant:

static int concatenate_results(void *arg, int ncols, char **vals, char **colnames) {
	auto &results = *((std::vector<std::vector<std::string>> *)arg);
	if (results.size() == 0) {
		results.resize(ncols);
	}
	for (int i = 0; i < ncols; i++) {
		results[i].push_back(vals[i] ? vals[i] : "NULL");
	}
	return SQLITE_OK;
}